

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O2

char * Curl_all_content_encodings(void)

{
  content_encoding *pcVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  content_encoding **ppcVar6;
  char *pcVar7;
  char *__dest;
  
  sVar5 = 0;
  for (ppcVar6 = encodings; pcVar1 = *ppcVar6, pcVar1 != (content_encoding *)0x0;
      ppcVar6 = ppcVar6 + 1) {
    iVar2 = Curl_strcasecompare(pcVar1->name,"identity");
    if (iVar2 == 0) {
      sVar3 = strlen(pcVar1->name);
      sVar5 = sVar5 + sVar3 + 2;
    }
  }
  if (sVar5 != 0) {
    pcVar4 = (char *)(*Curl_cmalloc)(sVar5);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      __dest = pcVar4;
      for (ppcVar6 = encodings; pcVar1 = *ppcVar6, pcVar1 != (content_encoding *)0x0;
          ppcVar6 = ppcVar6 + 1) {
        iVar2 = Curl_strcasecompare(pcVar1->name,"identity");
        if (iVar2 == 0) {
          strcpy(__dest,pcVar1->name);
          sVar3 = strlen(__dest);
          pcVar7 = __dest + sVar3;
          __dest = pcVar7 + 2;
          pcVar7[0] = ',';
          pcVar7[1] = ' ';
        }
      }
      __dest[-2] = '\0';
    }
    return pcVar4;
  }
  pcVar4 = (*Curl_cstrdup)("identity");
  return pcVar4;
}

Assistant:

char *Curl_all_content_encodings(void)
{
  size_t len = 0;
  const struct content_encoding * const *cep;
  const struct content_encoding *ce;
  char *ace;

  for(cep = encodings; *cep; cep++) {
    ce = *cep;
    if(!strcasecompare(ce->name, CONTENT_ENCODING_DEFAULT))
      len += strlen(ce->name) + 2;
  }

  if(!len)
    return strdup(CONTENT_ENCODING_DEFAULT);

  ace = malloc(len);
  if(ace) {
    char *p = ace;
    for(cep = encodings; *cep; cep++) {
      ce = *cep;
      if(!strcasecompare(ce->name, CONTENT_ENCODING_DEFAULT)) {
        strcpy(p, ce->name);
        p += strlen(p);
        *p++ = ',';
        *p++ = ' ';
      }
    }
    p[-2] = '\0';
  }

  return ace;
}